

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O0

string * __thiscall
Diligent::GetContextObjectName_abi_cxx11_
          (string *__return_storage_ptr__,Diligent *this,char *Object,bool bIsDeferred,
          Uint32 ContextId)

{
  ostream *this_00;
  undefined3 in_register_00000009;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream local_198 [376];
  uint local_20;
  byte local_19;
  Uint32 ContextId_local;
  bool bIsDeferred_local;
  char *Object_local;
  
  local_20 = CONCAT31(in_register_00000009,bIsDeferred);
  local_19 = (byte)Object & 1;
  _ContextId_local = this;
  Object_local = (char *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::operator<<(local_198,(char *)_ContextId_local);
  if ((local_19 & 1) == 0) {
    std::operator<<(local_198," of immediate context");
  }
  else {
    this_00 = std::operator<<(local_198," of deferred context #");
    std::ostream::operator<<(this_00,local_20);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

static std::string GetContextObjectName(const char* Object, bool bIsDeferred, Uint32 ContextId)
{
    std::stringstream ss;
    ss << Object;
    if (bIsDeferred)
        ss << " of deferred context #" << ContextId;
    else
        ss << " of immediate context";
    return ss.str();
}